

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_poller.cpp
# Opt level: O1

int __thiscall zmq::socket_poller_t::modify_fd(socket_poller_t *this,fd_t fd_,short events_)

{
  pointer piVar1;
  int iVar2;
  pointer piVar3;
  int *piVar4;
  
  piVar1 = (this->_items).
           super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (piVar3 = (this->_items).
                super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (piVar3 != piVar1 && ((piVar3->socket != (socket_base_t *)0x0 || (piVar3->fd != fd_))));
      piVar3 = piVar3 + 1) {
  }
  if (piVar3 == piVar1) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    iVar2 = -1;
  }
  else {
    piVar3->events = events_;
    this->_need_rebuild = true;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int zmq::socket_poller_t::modify_fd (fd_t fd_, short events_)
{
    const items_t::iterator it =
      find_if2 (_items.begin (), _items.end (), fd_, &is_fd);

    if (it == _items.end ()) {
        errno = EINVAL;
        return -1;
    }

    it->events = events_;
    _need_rebuild = true;

    return 0;
}